

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv6Transmitter::ClearAcceptList(RTPUDPv6Transmitter *this)

{
  RTPUDPv6Transmitter *this_local;
  
  if ((((this->init & 1U) != 0) && ((this->created & 1U) != 0)) && (this->receivemode == AcceptSome)
     ) {
    ClearAcceptIgnoreInfo(this);
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::ClearAcceptList()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created && receivemode == RTPTransmitter::AcceptSome)
		ClearAcceptIgnoreInfo();
	MAINMUTEX_UNLOCK
}